

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall
ImVector<ImGuiListClipperRange>::push_front
          (ImVector<ImGuiListClipperRange> *this,ImGuiListClipperRange *v)

{
  ImVector<ImGuiListClipperRange> *in_RSI;
  ImGuiListClipperRange *in_RDI;
  ImVector<ImGuiListClipperRange> *unaff_retaddr;
  
  if (in_RDI->Min == 0) {
    push_back(in_RSI,in_RDI);
  }
  else {
    insert(unaff_retaddr,in_RDI,(ImGuiListClipperRange *)in_RSI);
  }
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }